

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O1

void __thiscall
pybind11::cpp_function::initialize_generic
          (cpp_function *this,function_record *rec,char *text,type_info **types,size_t args)

{
  byte bVar1;
  ushort uVar2;
  pointer paVar3;
  handle hVar4;
  void *__ptr;
  bool bVar5;
  uint __val;
  _Alloc_hider _Var6;
  uint uVar7;
  char cVar8;
  int iVar9;
  uint uVar10;
  char *pcVar11;
  long *plVar12;
  type_info *ptVar13;
  handle *phVar14;
  undefined8 *puVar15;
  function_record *pfVar16;
  function_record *pfVar17;
  PyMethodDef *pPVar18;
  object *poVar19;
  PyObject *pPVar20;
  undefined8 extraout_RAX;
  undefined8 uVar21;
  PyObject *pPVar22;
  error_already_set *this_00;
  ushort uVar23;
  PyBufferProcs *pPVar24;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar25;
  ulong *puVar26;
  ulong uVar27;
  PyTypeObject *pPVar28;
  size_type *psVar29;
  pointer paVar30;
  function_record *pfVar31;
  char cVar32;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  uint uVar33;
  inquiry p_Var34;
  uint __len;
  function_record *pfVar35;
  ulong uVar36;
  long lVar37;
  undefined1 auVar38 [16];
  string signatures;
  capsule rec_capsule_2;
  object scope_module;
  string signature;
  undefined1 local_1c8 [16];
  undefined1 local_1b8 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  function_record *local_168;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  allocator<char> local_139;
  enable_if_t<detail::move_if_unreferenced<basic_string<char>_>::value,_std::__cxx11::basic_string<char>_>
  local_138;
  undefined1 local_118 [16];
  undefined1 local_108 [16];
  inquiry local_f8;
  cpp_function *local_f0;
  function_record *local_e8;
  undefined1 local_e0 [24];
  object local_c8;
  PyGetSetDef *local_c0;
  str local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  accessor<pybind11::detail::accessor_policies::str_attr> local_50;
  
  this_01 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c8;
  pcVar11 = "";
  if (rec->name != (char *)0x0) {
    pcVar11 = rec->name;
  }
  local_f8 = (inquiry)args;
  local_f0 = this;
  local_e8 = (function_record *)types;
  pcVar11 = strdup(pcVar11);
  rec->name = pcVar11;
  if (rec->doc != (char *)0x0) {
    pcVar11 = strdup(rec->doc);
    rec->doc = pcVar11;
  }
  paVar30 = (rec->args).
            super__Vector_base<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
            ._M_impl.super__Vector_impl_data._M_start;
  paVar3 = (rec->args).
           super__Vector_base<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_168 = rec;
  if (paVar30 != paVar3) {
    do {
      if (*(char **)paVar30 != (char *)0x0) {
        pcVar11 = strdup(*(char **)paVar30);
        *(char **)paVar30 = pcVar11;
      }
      if (*(char **)(paVar30 + 8) == (char *)0x0) {
        if (*(long *)(paVar30 + 0x10) != 0) {
          auVar38 = PyObject_Repr(*(undefined8 *)(paVar30 + 0x10));
          if ((PyTypeObject *)auVar38._0_8_ == (PyTypeObject *)0x0) {
            this_00 = (error_already_set *)__cxa_allocate_exception(0x28);
            error_already_set::error_already_set(this_00);
            __cxa_throw(this_00,&error_already_set::typeinfo,error_already_set::~error_already_set);
          }
          local_1c8._0_8_ = auVar38._0_8_;
          cast<std::__cxx11::string>(&local_138,(pybind11 *)local_1c8,auVar38._8_8_);
          _Var6._M_p = local_138._M_dataplus._M_p;
          pcVar11 = strdup(local_138._M_dataplus._M_p);
          *(char **)(paVar30 + 8) = pcVar11;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Var6._M_p != &local_138.field_2) {
            operator_delete(_Var6._M_p,
                            CONCAT71(local_138.field_2._M_allocated_capacity._1_7_,
                                     local_138.field_2._M_local_buf[0]) + 1);
          }
          object::~object((object *)local_1c8);
        }
      }
      else {
        pcVar11 = strdup(*(char **)(paVar30 + 8));
        *(char **)(paVar30 + 8) = pcVar11;
      }
      paVar30 = paVar30 + 0x20;
    } while (paVar30 != paVar3);
  }
  pcVar11 = local_168->name;
  iVar9 = strcmp(pcVar11,"__init__");
  if (iVar9 == 0) {
    uVar23 = 1;
  }
  else {
    iVar9 = strcmp(pcVar11,"__setstate__");
    uVar23 = (ushort)(iVar9 == 0);
  }
  pfVar31 = local_168;
  uVar2 = *(ushort *)&local_168->field_0x59;
  *(ushort *)&local_168->field_0x59 = uVar2 & 0xfffe | uVar23;
  if (((uVar2 & 2) == 0 & (byte)uVar23) == 1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_138,(char *)(local_168->scope).m_ptr[1].ob_type,
               (allocator<char> *)local_1c8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_1c8,pfVar31->name,(allocator<char> *)&local_1a8);
    uVar21 = _PyExc_FutureWarning;
    std::operator+(&local_160,"pybind11-bound class \'",&local_138);
    plVar12 = (long *)std::__cxx11::string::append((char *)&local_160);
    pPVar24 = (PyBufferProcs *)(plVar12 + 2);
    if ((PyBufferProcs *)*plVar12 == pPVar24) {
      local_108._0_8_ = pPVar24->bf_getbuffer;
      local_108._8_8_ = plVar12[3];
      local_118._0_8_ = (PyObject *)local_108;
    }
    else {
      local_108._0_8_ = pPVar24->bf_getbuffer;
      local_118._0_8_ = (PyObject *)*plVar12;
    }
    local_118._8_8_ = plVar12[1];
    *plVar12 = (long)pPVar24;
    plVar12[1] = 0;
    *(undefined1 *)(plVar12 + 2) = 0;
    plVar12 = (long *)std::__cxx11::string::_M_append(local_118,local_1c8._0_8_);
    paVar25 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar12 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar12 == paVar25) {
      local_188.field_2._M_allocated_capacity = paVar25->_M_allocated_capacity;
      local_188.field_2._8_8_ = plVar12[3];
      local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
    }
    else {
      local_188.field_2._M_allocated_capacity = paVar25->_M_allocated_capacity;
      local_188._M_dataplus._M_p = (pointer)*plVar12;
    }
    local_188._M_string_length = plVar12[1];
    *plVar12 = (long)paVar25;
    plVar12[1] = 0;
    *(undefined1 *)(plVar12 + 2) = 0;
    plVar12 = (long *)std::__cxx11::string::append((char *)&local_188);
    puVar26 = (ulong *)(plVar12 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar12 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar26) {
      local_1a8.field_2._M_allocated_capacity = *puVar26;
      local_1a8.field_2._8_8_ = plVar12[3];
      local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
    }
    else {
      local_1a8.field_2._M_allocated_capacity = *puVar26;
      local_1a8._M_dataplus._M_p = (pointer)*plVar12;
    }
    local_1a8._M_string_length = plVar12[1];
    *plVar12 = (long)puVar26;
    plVar12[1] = 0;
    *(undefined1 *)(plVar12 + 2) = 0;
    PyErr_WarnEx(uVar21,local_1a8._M_dataplus._M_p,0);
    pfVar31 = local_168;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
      operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_188._M_dataplus._M_p != &local_188.field_2) {
      operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1);
    }
    if ((PyObject *)local_118._0_8_ != (PyObject *)local_108) {
      operator_delete((void *)local_118._0_8_,(ulong)(local_108._0_8_ + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_160._M_dataplus._M_p != &local_160.field_2) {
      operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
    }
    if ((PyTypeObject *)local_1c8._0_8_ != (PyTypeObject *)local_1b8) {
      operator_delete((void *)local_1c8._0_8_,(ulong)(local_1b8._0_8_ + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138._M_dataplus._M_p != &local_138.field_2) {
      operator_delete(local_138._M_dataplus._M_p,
                      CONCAT71(local_138.field_2._M_allocated_capacity._1_7_,
                               local_138.field_2._M_local_buf[0]) + 1);
    }
  }
  local_c0 = (PyGetSetDef *)&pfVar31->args;
  local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
  local_138._M_string_length = 0;
  local_138.field_2._M_local_buf[0] = '\0';
  p_Var34 = (inquiry)0x0;
  lVar37 = 0;
  do {
    bVar1 = *text;
    if (bVar1 < 0x7b) {
      if (bVar1 == 0x25) {
        hVar4.m_ptr = (PyObject *)local_e8->data[lVar37 + -7];
        if ((PyTypeObject *)hVar4.m_ptr == (PyTypeObject *)0x0) {
          pybind11_fail("Internal error while parsing type signature (1)");
        }
        local_1c8._0_8_ = hVar4.m_ptr;
        ptVar13 = detail::get_type_info((type_index *)local_1c8,false);
        lVar37 = lVar37 + 1;
        if (ptVar13 == (type_info *)0x0) {
          if ((p_Var34 == (inquiry)0x0 & (byte)pfVar31->field_0x59 >> 1) != 1) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)local_1c8,
                       (char *)((long)&((hVar4.m_ptr)->ob_type->ob_base).ob_base.ob_refcnt +
                               (ulong)((char)((hVar4.m_ptr)->ob_type->ob_base).ob_base.ob_refcnt ==
                                      '*')),(allocator<char> *)&local_1a8);
            detail::clean_type_id((string *)local_1c8);
            std::__cxx11::string::_M_append((char *)&local_138,local_1c8._0_8_);
            if ((PyTypeObject *)local_1c8._0_8_ != (PyTypeObject *)local_1b8) {
              operator_delete((void *)local_1c8._0_8_,(ulong)(local_1b8._0_8_ + 1));
            }
            goto LAB_0010b55f;
          }
          local_118._8_8_ = (pfVar31->scope).m_ptr;
          local_108._0_8_ = "__module__";
          local_108._8_8_ = (PyObject *)0x0;
          phVar14 = &detail::accessor<pybind11::detail::accessor_policies::str_attr>::get_cache
                               ((accessor<pybind11::detail::accessor_policies::str_attr> *)local_118
                               )->super_handle;
          cast<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                    (&local_188,phVar14);
          puVar15 = (undefined8 *)std::__cxx11::string::append((char *)&local_188);
          local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
          puVar26 = puVar15 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar15 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar26) {
            local_1a8.field_2._M_allocated_capacity = *puVar26;
            local_1a8.field_2._8_8_ = puVar15[3];
          }
          else {
            local_1a8.field_2._M_allocated_capacity = *puVar26;
            local_1a8._M_dataplus._M_p = (pointer)*puVar15;
          }
          local_1a8._M_string_length = puVar15[1];
          *puVar15 = puVar26;
          puVar15[1] = 0;
          *(undefined1 *)(puVar15 + 2) = 0;
          local_e0._8_8_ = (pfVar31->scope).m_ptr;
          local_e0._16_8_ = "__qualname__";
          local_c8.super_handle.m_ptr = (handle)(PyObject *)0x0;
          phVar14 = &detail::accessor<pybind11::detail::accessor_policies::str_attr>::get_cache
                               ((accessor<pybind11::detail::accessor_policies::str_attr> *)local_e0)
                     ->super_handle;
          cast<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                    (&local_160,phVar14);
          uVar21 = (char *)0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
            uVar21 = local_1a8.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar21 <
              (char *)(local_1a8._M_string_length + (long)(binaryfunc *)local_160._M_string_length))
          {
            uVar21 = (char *)0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_160._M_dataplus._M_p != &local_160.field_2) {
              uVar21 = local_160.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar21 <
                (char *)(local_1a8._M_string_length + (long)(binaryfunc *)local_160._M_string_length
                        )) goto LAB_0010b360;
            plVar12 = (long *)std::__cxx11::string::replace
                                        ((ulong)&local_160,0,(char *)0x0,
                                         (ulong)local_1a8._M_dataplus._M_p);
          }
          else {
LAB_0010b360:
            plVar12 = (long *)std::__cxx11::string::_M_append
                                        ((char *)&local_1a8,(ulong)local_160._M_dataplus._M_p);
          }
          local_1c8._0_8_ = local_1b8;
          pPVar28 = (PyTypeObject *)(plVar12 + 2);
          if ((PyTypeObject *)*plVar12 == pPVar28) {
            local_1b8._0_8_ = (pPVar28->ob_base).ob_base.ob_refcnt;
            local_1b8._8_8_ = plVar12[3];
          }
          else {
            local_1b8._0_8_ = (pPVar28->ob_base).ob_base.ob_refcnt;
            local_1c8._0_8_ = (PyObject *)*plVar12;
          }
          local_1c8._8_8_ = plVar12[1];
          *plVar12 = (long)pPVar28;
          plVar12[1] = 0;
          *(undefined1 *)&(pPVar28->ob_base).ob_base.ob_refcnt = 0;
          std::__cxx11::string::_M_append((char *)&local_138,local_1c8._0_8_);
        }
        else {
          pPVar28 = ptVar13->type;
          local_108._0_8_ = "__module__";
          local_108._8_8_ = (PyObject *)0x0;
          local_118._8_8_ = pPVar28;
          phVar14 = &detail::accessor<pybind11::detail::accessor_policies::str_attr>::get_cache
                               ((accessor<pybind11::detail::accessor_policies::str_attr> *)local_118
                               )->super_handle;
          cast<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                    (&local_188,phVar14);
          plVar12 = (long *)std::__cxx11::string::append((char *)&local_188);
          local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
          puVar26 = (ulong *)(plVar12 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar12 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar26) {
            local_1a8.field_2._M_allocated_capacity = *puVar26;
            local_1a8.field_2._8_8_ = plVar12[3];
          }
          else {
            local_1a8.field_2._M_allocated_capacity = *puVar26;
            local_1a8._M_dataplus._M_p = (pointer)*plVar12;
          }
          local_1a8._M_string_length = plVar12[1];
          *plVar12 = (long)puVar26;
          plVar12[1] = 0;
          *(undefined1 *)(plVar12 + 2) = 0;
          local_e0._16_8_ = "__qualname__";
          local_c8.super_handle.m_ptr = (handle)(PyObject *)0x0;
          local_e0._8_8_ = pPVar28;
          phVar14 = &detail::accessor<pybind11::detail::accessor_policies::str_attr>::get_cache
                               ((accessor<pybind11::detail::accessor_policies::str_attr> *)local_e0)
                     ->super_handle;
          cast<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                    (&local_160,phVar14);
          uVar21 = (char *)0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
            uVar21 = local_1a8.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar21 <
              (char *)(local_1a8._M_string_length + (long)(binaryfunc *)local_160._M_string_length))
          {
            uVar21 = (char *)0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_160._M_dataplus._M_p != &local_160.field_2) {
              uVar21 = local_160.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar21 <
                (char *)(local_1a8._M_string_length + (long)(binaryfunc *)local_160._M_string_length
                        )) goto LAB_0010b1c9;
            plVar12 = (long *)std::__cxx11::string::replace
                                        ((ulong)&local_160,0,(char *)0x0,
                                         (ulong)local_1a8._M_dataplus._M_p);
          }
          else {
LAB_0010b1c9:
            plVar12 = (long *)std::__cxx11::string::_M_append
                                        ((char *)&local_1a8,(ulong)local_160._M_dataplus._M_p);
          }
          local_1c8._0_8_ = local_1b8;
          pPVar28 = (PyTypeObject *)(plVar12 + 2);
          if ((PyTypeObject *)*plVar12 == pPVar28) {
            local_1b8._0_8_ = (pPVar28->ob_base).ob_base.ob_refcnt;
            local_1b8._8_8_ = plVar12[3];
          }
          else {
            local_1b8._0_8_ = (pPVar28->ob_base).ob_base.ob_refcnt;
            local_1c8._0_8_ = (PyObject *)*plVar12;
          }
          local_1c8._8_8_ = plVar12[1];
          *plVar12 = (long)pPVar28;
          plVar12[1] = 0;
          *(undefined1 *)&(pPVar28->ob_base).ob_base.ob_refcnt = 0;
          std::__cxx11::string::_M_append((char *)&local_138,local_1c8._0_8_);
        }
        if ((PyObject *)local_1c8._0_8_ != (PyObject *)local_1b8) {
          operator_delete((void *)local_1c8._0_8_,(ulong)(local_1b8._0_8_ + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_160._M_dataplus._M_p != &local_160.field_2) {
          operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
        }
        object::~object(&local_c8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
          operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_188._M_dataplus._M_p != &local_188.field_2) {
          operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1);
        }
        object::~object((object *)(local_108 + 8));
      }
      else {
        if (bVar1 == 0) break;
LAB_0010b07b:
        std::__cxx11::string::push_back((char)&local_138);
      }
    }
    else if (bVar1 == 0x7b) {
      if (((byte *)text)[1] != 0x2a) {
        if (p_Var34 + pfVar31->nargs_kw_only == local_f8 && pfVar31->nargs_kw_only != 0) {
          std::__cxx11::string::append((char *)&local_138);
        }
        paVar30 = (pfVar31->args).
                  super__Vector_base<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if (((p_Var34 < (inquiry)((long)(pfVar31->args).
                                        super__Vector_base<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                                        ._M_impl.super__Vector_impl_data._M_finish - (long)paVar30
                                 >> 5)) && (*(long *)(paVar30 + (long)p_Var34 * 0x20) != 0)) ||
           ((p_Var34 == (inquiry)0x0 && ((pfVar31->field_0x59 & 0x10) != 0)))) {
          std::__cxx11::string::append((char *)&local_138);
        }
        else {
          uVar36 = (long)p_Var34 - (ulong)((*(ushort *)&pfVar31->field_0x59 >> 4 & 1) != 0);
          cVar32 = '\x01';
          if (9 < uVar36) {
            uVar27 = uVar36;
            cVar8 = '\x04';
            do {
              cVar32 = cVar8;
              if (uVar27 < 100) {
                cVar32 = cVar32 + -2;
                goto LAB_0010b470;
              }
              if (uVar27 < 1000) {
                cVar32 = cVar32 + -1;
                goto LAB_0010b470;
              }
              if (uVar27 < 10000) goto LAB_0010b470;
              bVar5 = 99999 < uVar27;
              uVar27 = uVar27 / 10000;
              cVar8 = cVar32 + '\x04';
            } while (bVar5);
            cVar32 = cVar32 + '\x01';
          }
LAB_0010b470:
          local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
          std::__cxx11::string::_M_construct((ulong)&local_1a8,cVar32);
          std::__detail::__to_chars_10_impl<unsigned_long>
                    (local_1a8._M_dataplus._M_p,(uint)local_1a8._M_string_length,uVar36);
          plVar12 = (long *)std::__cxx11::string::replace((ulong)&local_1a8,0,(char *)0x0,0x1177a6);
          pfVar31 = local_168;
          local_1c8._0_8_ = local_1b8;
          pPVar28 = (PyTypeObject *)(plVar12 + 2);
          if ((PyTypeObject *)*plVar12 == pPVar28) {
            local_1b8._0_8_ = (pPVar28->ob_base).ob_base.ob_refcnt;
            local_1b8._8_8_ = plVar12[3];
          }
          else {
            local_1b8._0_8_ = (pPVar28->ob_base).ob_base.ob_refcnt;
            local_1c8._0_8_ = (PyObject *)*plVar12;
          }
          local_1c8._8_8_ = plVar12[1];
          *plVar12 = (long)pPVar28;
          plVar12[1] = 0;
          *(undefined1 *)(plVar12 + 2) = 0;
          std::__cxx11::string::_M_append((char *)&local_138,local_1c8._0_8_);
          if ((PyTypeObject *)local_1c8._0_8_ != (PyTypeObject *)local_1b8) {
            operator_delete((void *)local_1c8._0_8_,(ulong)(local_1b8._0_8_ + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
            operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
          }
        }
        std::__cxx11::string::append((char *)&local_138);
      }
    }
    else {
      if (bVar1 != 0x7d) goto LAB_0010b07b;
      paVar30 = (pfVar31->args).
                super__Vector_base<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if ((p_Var34 < (inquiry)((long)(pfVar31->args).
                                     super__Vector_base<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)paVar30 >> 5
                              )) && (*(long *)(paVar30 + (long)p_Var34 * 0x20 + 8) != 0)) {
        std::__cxx11::string::append((char *)&local_138);
        std::__cxx11::string::append((char *)&local_138);
      }
      p_Var34 = p_Var34 + 1;
      if (p_Var34 == (inquiry)(ulong)pfVar31->nargs_pos_only && pfVar31->nargs_pos_only != 0) {
        std::__cxx11::string::append((char *)&local_138);
      }
    }
LAB_0010b55f:
    text = (char *)((byte *)text + 1);
  } while( true );
  if ((p_Var34 != local_f8) || (local_e8->data[lVar37 + -7] != (void *)0x0)) {
    pybind11_fail("Internal error while parsing type signature (2)");
  }
  pcVar11 = strdup(local_138._M_dataplus._M_p);
  pfVar31->signature = pcVar11;
  if ((pfVar31->args).
      super__Vector_base<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage !=
      (pfVar31->args).
      super__Vector_base<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::
    __shrink_to_fit_aux<std::vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>,_true>
    ::_S_do_it((vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                *)local_c0);
  }
  pfVar31->nargs = (uint16_t)local_f8;
  pPVar20 = (pfVar31->sibling).m_ptr;
  if ((pPVar20 != (PyObject *)0x0) && (pPVar20->ob_type == (PyTypeObject *)&PyInstanceMethod_Type))
  {
    (pfVar31->sibling).m_ptr = (PyObject *)pPVar20[1].ob_refcnt;
  }
  pPVar20 = (pfVar31->sibling).m_ptr;
  if (pPVar20 == (PyObject *)0x0) {
LAB_0010b662:
    pfVar35 = (function_record *)0x0;
  }
  else {
    pPVar28 = pPVar20->ob_type;
    if ((pPVar28 != (PyTypeObject *)&PyCFunction_Type) &&
       (iVar9 = PyType_IsSubtype(pPVar28,&PyCFunction_Type), iVar9 == 0)) {
      if (((pfVar31->sibling).m_ptr != (PyObject *)&_Py_NoneStruct) && (*pfVar31->name != '_')) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_188,pfVar31->name,(allocator<char> *)local_118);
        std::operator+(&local_1a8,"Cannot overload existing non-function object \"",&local_188);
        plVar12 = (long *)std::__cxx11::string::append((char *)&local_1a8);
        local_1c8._0_8_ = *plVar12;
        pPVar20 = (PyObject *)(plVar12 + 2);
        if ((PyObject *)local_1c8._0_8_ == pPVar20) {
          local_1b8._0_8_ = pPVar20->ob_refcnt;
          local_1b8._8_8_ = plVar12[3];
          local_1c8._0_8_ = (PyObject *)local_1b8;
        }
        else {
          local_1b8._0_8_ = pPVar20->ob_refcnt;
        }
        local_1c8._8_8_ = plVar12[1];
        *plVar12 = (long)pPVar20;
        plVar12[1] = 0;
        *(undefined1 *)(plVar12 + 2) = 0;
        pybind11_fail((string *)local_1c8);
      }
      goto LAB_0010b662;
    }
    pPVar20 = (pfVar31->sibling).m_ptr;
    if ((*(byte *)(pPVar20[1].ob_refcnt + 0x10) & 0x20) == 0) {
      local_1c8._0_8_ = pPVar20[1].ob_type;
    }
    else {
      local_1c8._0_8_ = (PyTypeObject *)0x0;
    }
    if ((PyTypeObject *)local_1c8._0_8_ != (PyTypeObject *)0x0) {
      (((PyVarObject *)&((PyObject *)local_1c8._0_8_)->ob_refcnt)->ob_base).ob_refcnt =
           (((PyVarObject *)&((PyObject *)local_1c8._0_8_)->ob_refcnt)->ob_base).ob_refcnt + 1;
    }
    pfVar16 = capsule::get_pointer<pybind11::detail::function_record>((capsule *)local_1c8);
    pfVar35 = (function_record *)0x0;
    if ((pfVar16->scope).m_ptr == (pfVar31->scope).m_ptr) {
      pfVar35 = pfVar16;
    }
    object::~object((object *)local_1c8);
  }
  if (pfVar35 == (function_record *)0x0) {
    pPVar18 = (PyMethodDef *)operator_new(0x20);
    *(undefined8 *)&pPVar18->ml_flags = 0;
    pPVar18->ml_doc = (char *)0x0;
    pPVar18->ml_name = (char *)0x0;
    pPVar18->ml_meth = (PyCFunction)0x0;
    pfVar31->def = pPVar18;
    *(undefined8 *)&pPVar18->ml_flags = 0;
    pPVar18->ml_doc = (char *)0x0;
    pPVar18->ml_name = (char *)0x0;
    pPVar18->ml_meth = (PyCFunction)0x0;
    pPVar18->ml_name = pfVar31->name;
    pPVar18->ml_meth = dispatcher;
    pPVar18->ml_flags = 3;
    capsule::capsule((capsule *)&local_1a8,pfVar31,
                     initialize_generic::anon_class_1_0_00000001::__invoke);
    local_188._M_dataplus._M_p = (pointer)0x0;
    pPVar20 = (pfVar31->scope).m_ptr;
    if (pPVar20 != (PyObject *)0x0) {
      iVar9 = PyObject_HasAttrString(pPVar20,"__module__");
      if (iVar9 == 1) {
        local_1c8._8_8_ = (pfVar31->scope).m_ptr;
        local_1b8._0_8_ = "__module__";
        local_1b8._8_8_ = 0;
        poVar19 = detail::accessor<pybind11::detail::accessor_policies::str_attr>::get_cache
                            ((accessor<pybind11::detail::accessor_policies::str_attr> *)local_1c8);
      }
      else {
        iVar9 = PyObject_HasAttrString((pfVar31->scope).m_ptr,"__name__");
        if (iVar9 != 1) goto LAB_0010b7fd;
        local_1c8._8_8_ = (pfVar31->scope).m_ptr;
        local_1b8._0_8_ = "__name__";
        local_1b8._8_8_ = 0;
        poVar19 = detail::accessor<pybind11::detail::accessor_policies::str_attr>::get_cache
                            ((accessor<pybind11::detail::accessor_policies::str_attr> *)local_1c8);
      }
      local_118._0_8_ = (poVar19->super_handle).m_ptr;
      if ((PyBufferProcs *)local_118._0_8_ != (PyBufferProcs *)0x0) {
        ((PyObject *)local_118._0_8_)->ob_refcnt =
             (Py_ssize_t)((getbufferproc)((PyObject *)local_118._0_8_)->ob_refcnt + 1);
      }
      object::operator=((object *)&local_188,(object *)local_118);
      object::~object((object *)local_118);
      object::~object((object *)(local_1b8 + 8));
      pfVar31 = local_168;
    }
LAB_0010b7fd:
    pPVar20 = (PyObject *)
              PyCMethod_New(pfVar31->def,local_1a8._M_dataplus._M_p,local_188._M_dataplus._M_p,0);
    (local_f0->super_function).super_object.super_handle.m_ptr = pPVar20;
    if (pPVar20 == (PyObject *)0x0) {
      pybind11_fail("cpp_function::cpp_function(): Could not allocate function object");
    }
    object::~object((object *)&local_188);
    this_01 = &local_1a8;
  }
  else {
    pPVar20 = (pfVar31->sibling).m_ptr;
    (local_f0->super_function).super_object.super_handle.m_ptr = pPVar20;
    if (pPVar20 != (PyObject *)0x0) {
      pPVar20->ob_refcnt = pPVar20->ob_refcnt + 1;
    }
    uVar23 = *(ushort *)&pfVar31->field_0x59;
    if (((*(ushort *)&pfVar35->field_0x59 ^ uVar23) & 0x10) != 0) {
      iVar9 = 0x117d44;
      if ((uVar23 & 0x10) == 0) {
        iVar9 = 0x11791f;
      }
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_b0,iVar9,((uVar23 & 0x10) >> 3) + iVar9 + 6);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e0,
                     "overloading a method with both static and instance methods is not supported; error while attempting to bind "
                     ,&local_b0);
      plVar12 = (long *)std::__cxx11::string::append(local_e0);
      local_160._M_dataplus._M_p = (pointer)*plVar12;
      psVar29 = (size_type *)(plVar12 + 2);
      if ((size_type *)local_160._M_dataplus._M_p == psVar29) {
        local_160.field_2._M_allocated_capacity = *psVar29;
        local_160.field_2._8_8_ = plVar12[3];
        local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
      }
      else {
        local_160.field_2._M_allocated_capacity = *psVar29;
      }
      local_160._M_string_length = plVar12[1];
      *plVar12 = (long)psVar29;
      plVar12[1] = 0;
      *(undefined1 *)(plVar12 + 2) = 0;
      local_50.obj.m_ptr = (local_168->scope).m_ptr;
      local_50.key = "__name__";
      local_50.cache.super_handle.m_ptr = (handle)(PyObject *)0x0;
      str::str<pybind11::detail::accessor_policies::str_attr>(&local_b8,&local_50);
      str::operator_cast_to_string(&local_70,&local_b8);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_118,
                     &local_160,&local_70);
      plVar12 = (long *)std::__cxx11::string::append(local_118);
      local_188._M_dataplus._M_p = (pointer)*plVar12;
      paVar25 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(plVar12 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_188._M_dataplus._M_p == paVar25) {
        local_188.field_2._M_allocated_capacity = paVar25->_M_allocated_capacity;
        local_188.field_2._8_8_ = plVar12[3];
        local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
      }
      else {
        local_188.field_2._M_allocated_capacity = paVar25->_M_allocated_capacity;
      }
      local_188._M_string_length = plVar12[1];
      *plVar12 = (long)paVar25;
      plVar12[1] = 0;
      *(undefined1 *)(plVar12 + 2) = 0;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_90,local_168->name,&local_139);
      std::operator+(&local_1a8,&local_188,&local_90);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c8,
                     &local_1a8,&local_138);
      pybind11_fail((string *)local_1c8);
    }
    pfVar16 = pfVar35;
    if ((uVar23 >> 8 & 1) == 0) {
      do {
        pfVar17 = pfVar16;
        pfVar16 = pfVar17->next;
      } while (pfVar16 != (function_record *)0x0);
      pfVar17->next = pfVar31;
      uVar21 = 0;
      pfVar31 = pfVar35;
      goto LAB_0010b83d;
    }
    pfVar31->next = pfVar35;
    local_1c8._0_8_ = pPVar20[1].ob_type;
    if ((PyTypeObject *)local_1c8._0_8_ != (PyTypeObject *)0x0) {
      (((PyVarObject *)&((PyObject *)local_1c8._0_8_)->ob_refcnt)->ob_base).ob_refcnt =
           (((PyVarObject *)&((PyObject *)local_1c8._0_8_)->ob_refcnt)->ob_base).ob_refcnt + 1;
    }
    iVar9 = PyCapsule_SetPointer(local_1c8._0_8_,pfVar31);
    if (iVar9 != 0) {
      pybind11_fail("Could not set capsule pointer");
    }
  }
  object::~object((object *)this_01);
  uVar21 = extraout_RAX;
LAB_0010b83d:
  local_1c8._8_8_ = (PyObject *)0x0;
  local_1b8._0_8_ = local_1b8._0_8_ & 0xffffffffffffff00;
  local_1c8._0_8_ = (PyObject *)local_1b8;
  if ((pfVar35 != (function_record *)0x0) && (DAT_00121599 == '\x01')) {
    std::__cxx11::string::append(local_1c8);
    std::__cxx11::string::append(local_1c8);
    uVar21 = std::__cxx11::string::append(local_1c8);
  }
  if (pfVar31 != (function_record *)0x0) {
    uVar33 = 0;
    local_f8 = (inquiry)CONCAT44(local_f8._4_4_,(int)CONCAT71((int7)((ulong)uVar21 >> 8),1));
    local_e8 = pfVar35;
    do {
      if (DAT_00121599 == '\x01') {
        if (0 < (int)uVar33) {
          std::__cxx11::string::append(local_1c8);
        }
        if (pfVar35 != (function_record *)0x0) {
          uVar33 = uVar33 + 1;
          __val = -uVar33;
          if (0 < (int)uVar33) {
            __val = uVar33;
          }
          __len = 1;
          if (9 < __val) {
            uVar36 = (ulong)__val;
            uVar7 = 4;
            do {
              __len = uVar7;
              uVar10 = (uint)uVar36;
              if (uVar10 < 100) {
                __len = __len - 2;
                goto LAB_0010b930;
              }
              if (uVar10 < 1000) {
                __len = __len - 1;
                goto LAB_0010b930;
              }
              if (uVar10 < 10000) goto LAB_0010b930;
              uVar36 = uVar36 / 10000;
              uVar7 = __len + 4;
            } while (99999 < uVar10);
            __len = __len + 1;
          }
LAB_0010b930:
          local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
          std::__cxx11::string::_M_construct
                    ((ulong)&local_188,(char)__len - (char)((int)uVar33 >> 0x1f));
          std::__detail::__to_chars_10_impl<unsigned_int>
                    (local_188._M_dataplus._M_p + (uVar33 >> 0x1f),__len,__val);
          puVar15 = (undefined8 *)std::__cxx11::string::append((char *)&local_188);
          pfVar35 = local_e8;
          local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
          puVar26 = puVar15 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar15 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar26) {
            local_1a8.field_2._M_allocated_capacity = *puVar26;
            local_1a8.field_2._8_8_ = puVar15[3];
          }
          else {
            local_1a8.field_2._M_allocated_capacity = *puVar26;
            local_1a8._M_dataplus._M_p = (pointer)*puVar15;
          }
          local_1a8._M_string_length = puVar15[1];
          *puVar15 = puVar26;
          puVar15[1] = 0;
          *(undefined1 *)(puVar15 + 2) = 0;
          std::__cxx11::string::_M_append(local_1c8,(ulong)local_1a8._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
            operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_188._M_dataplus._M_p != &local_188.field_2) {
            operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1);
          }
        }
        std::__cxx11::string::append(local_1c8);
        std::__cxx11::string::append(local_1c8);
        std::__cxx11::string::append(local_1c8);
      }
      if (((pfVar31->doc != (char *)0x0) && (*pfVar31->doc != '\0')) &&
         (options::global_state()::instance == '\x01')) {
        if (DAT_00121599 == '\0') {
          if (((ulong)local_f8 & 1) == 0) {
            std::__cxx11::string::append(local_1c8);
          }
          else {
            local_f8 = (inquiry)((ulong)local_f8 & 0xffffffff00000000);
          }
        }
        if (DAT_00121599 == '\x01') {
          std::__cxx11::string::append(local_1c8);
        }
        std::__cxx11::string::append(local_1c8);
        if (DAT_00121599 == '\x01') {
          std::__cxx11::string::append(local_1c8);
        }
      }
      pfVar31 = pfVar31->next;
    } while (pfVar31 != (function_record *)0x0);
  }
  pPVar20 = (local_f0->super_function).super_object.super_handle.m_ptr;
  __ptr = *(void **)(pPVar20[1].ob_refcnt + 0x18);
  if (__ptr != (void *)0x0) {
    free(__ptr);
  }
  pcVar11 = strdup((char *)local_1c8._0_8_);
  *(char **)(pPVar20[1].ob_refcnt + 0x18) = pcVar11;
  if ((local_168->field_0x59 & 0x10) != 0) {
    pPVar22 = (PyObject *)
              PyInstanceMethod_New((local_f0->super_function).super_object.super_handle.m_ptr);
    (local_f0->super_function).super_object.super_handle.m_ptr = pPVar22;
    if (pPVar22 == (PyObject *)0x0) {
      pybind11_fail("cpp_function::cpp_function(): Could not allocate instance method object");
    }
    pPVar20->ob_refcnt = pPVar20->ob_refcnt + -1;
    if (pPVar20->ob_refcnt == 0) {
      _Py_Dealloc(pPVar20);
    }
  }
  if ((PyObject *)local_1c8._0_8_ != (PyObject *)local_1b8) {
    operator_delete((void *)local_1c8._0_8_,local_1b8._0_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p != &local_138.field_2) {
    operator_delete(local_138._M_dataplus._M_p,
                    CONCAT71(local_138.field_2._M_allocated_capacity._1_7_,
                             local_138.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void initialize_generic(detail::function_record *rec, const char *text,
                            const std::type_info *const *types, size_t args) {

        /* Create copies of all referenced C-style strings */
        rec->name = strdup(rec->name ? rec->name : "");
        if (rec->doc) rec->doc = strdup(rec->doc);
        for (auto &a: rec->args) {
            if (a.name)
                a.name = strdup(a.name);
            if (a.descr)
                a.descr = strdup(a.descr);
            else if (a.value)
                a.descr = strdup(repr(a.value).cast<std::string>().c_str());
        }

        rec->is_constructor = !strcmp(rec->name, "__init__") || !strcmp(rec->name, "__setstate__");

#if !defined(NDEBUG) && !defined(PYBIND11_DISABLE_NEW_STYLE_INIT_WARNING)
        if (rec->is_constructor && !rec->is_new_style_constructor) {
            const auto class_name = detail::get_fully_qualified_tp_name((PyTypeObject *) rec->scope.ptr());
            const auto func_name = std::string(rec->name);
            PyErr_WarnEx(
                PyExc_FutureWarning,
                ("pybind11-bound class '" + class_name + "' is using an old-style "
                 "placement-new '" + func_name + "' which has been deprecated. See "
                 "the upgrade guide in pybind11's docs. This message is only visible "
                 "when compiled in debug mode.").c_str(), 0
            );
        }
#endif

        /* Generate a proper function signature */
        std::string signature;
        size_t type_index = 0, arg_index = 0;
        for (auto *pc = text; *pc != '\0'; ++pc) {
            const auto c = *pc;

            if (c == '{') {
                // Write arg name for everything except *args and **kwargs.
                if (*(pc + 1) == '*')
                    continue;
                // Separator for keyword-only arguments, placed before the kw
                // arguments start
                if (rec->nargs_kw_only > 0 && arg_index + rec->nargs_kw_only == args)
                    signature += "*, ";
                if (arg_index < rec->args.size() && rec->args[arg_index].name) {
                    signature += rec->args[arg_index].name;
                } else if (arg_index == 0 && rec->is_method) {
                    signature += "self";
                } else {
                    signature += "arg" + std::to_string(arg_index - (rec->is_method ? 1 : 0));
                }
                signature += ": ";
            } else if (c == '}') {
                // Write default value if available.
                if (arg_index < rec->args.size() && rec->args[arg_index].descr) {
                    signature += " = ";
                    signature += rec->args[arg_index].descr;
                }
                // Separator for positional-only arguments (placed after the
                // argument, rather than before like *
                if (rec->nargs_pos_only > 0 && (arg_index + 1) == rec->nargs_pos_only)
                    signature += ", /";
                arg_index++;
            } else if (c == '%') {
                const std::type_info *t = types[type_index++];
                if (!t)
                    pybind11_fail("Internal error while parsing type signature (1)");
                if (auto tinfo = detail::get_type_info(*t)) {
                    handle th((PyObject *) tinfo->type);
                    signature +=
                        th.attr("__module__").cast<std::string>() + "." +
                        th.attr("__qualname__").cast<std::string>(); // Python 3.3+, but we backport it to earlier versions
                } else if (rec->is_new_style_constructor && arg_index == 0) {
                    // A new-style `__init__` takes `self` as `value_and_holder`.
                    // Rewrite it to the proper class type.
                    signature +=
                        rec->scope.attr("__module__").cast<std::string>() + "." +
                        rec->scope.attr("__qualname__").cast<std::string>();
                } else {
                    std::string tname(t->name());
                    detail::clean_type_id(tname);
                    signature += tname;
                }
            } else {
                signature += c;
            }
        }

        if (arg_index != args || types[type_index] != nullptr)
            pybind11_fail("Internal error while parsing type signature (2)");

#if PY_MAJOR_VERSION < 3
        if (strcmp(rec->name, "__next__") == 0) {
            std::free(rec->name);
            rec->name = strdup("next");
        } else if (strcmp(rec->name, "__bool__") == 0) {
            std::free(rec->name);
            rec->name = strdup("__nonzero__");
        }
#endif
        rec->signature = strdup(signature.c_str());
        rec->args.shrink_to_fit();
        rec->nargs = (std::uint16_t) args;

        if (rec->sibling && PYBIND11_INSTANCE_METHOD_CHECK(rec->sibling.ptr()))
            rec->sibling = PYBIND11_INSTANCE_METHOD_GET_FUNCTION(rec->sibling.ptr());

        detail::function_record *chain = nullptr, *chain_start = rec;
        if (rec->sibling) {
            if (PyCFunction_Check(rec->sibling.ptr())) {
                auto rec_capsule = reinterpret_borrow<capsule>(PyCFunction_GET_SELF(rec->sibling.ptr()));
                chain = (detail::function_record *) rec_capsule;
                /* Never append a method to an overload chain of a parent class;
                   instead, hide the parent's overloads in this case */
                if (!chain->scope.is(rec->scope))
                    chain = nullptr;
            }
            // Don't trigger for things like the default __init__, which are wrapper_descriptors that we are intentionally replacing
            else if (!rec->sibling.is_none() && rec->name[0] != '_')
                pybind11_fail("Cannot overload existing non-function object \"" + std::string(rec->name) +
                        "\" with a function of the same name");
        }

        if (!chain) {
            /* No existing overload was found, create a new function object */
            rec->def = new PyMethodDef();
            std::memset(rec->def, 0, sizeof(PyMethodDef));
            rec->def->ml_name = rec->name;
            rec->def->ml_meth = reinterpret_cast<PyCFunction>(reinterpret_cast<void (*) (void)>(*dispatcher));
            rec->def->ml_flags = METH_VARARGS | METH_KEYWORDS;

            capsule rec_capsule(rec, [](void *ptr) {
                destruct((detail::function_record *) ptr);
            });

            object scope_module;
            if (rec->scope) {
                if (hasattr(rec->scope, "__module__")) {
                    scope_module = rec->scope.attr("__module__");
                } else if (hasattr(rec->scope, "__name__")) {
                    scope_module = rec->scope.attr("__name__");
                }
            }

            m_ptr = PyCFunction_NewEx(rec->def, rec_capsule.ptr(), scope_module.ptr());
            if (!m_ptr)
                pybind11_fail("cpp_function::cpp_function(): Could not allocate function object");
        } else {
            /* Append at the beginning or end of the overload chain */
            m_ptr = rec->sibling.ptr();
            inc_ref();
            if (chain->is_method != rec->is_method)
                pybind11_fail("overloading a method with both static and instance methods is not supported; "
                    #if defined(NDEBUG)
                        "compile in debug mode for more details"
                    #else
                        "error while attempting to bind " + std::string(rec->is_method ? "instance" : "static") + " method " +
                        std::string(pybind11::str(rec->scope.attr("__name__"))) + "." + std::string(rec->name) + signature
                    #endif
                );

            if (rec->prepend) {
                // Beginning of chain; we need to replace the capsule's current head-of-the-chain
                // pointer with this one, then make this one point to the previous head of the
                // chain.
                chain_start = rec;
                rec->next = chain;
                auto rec_capsule = reinterpret_borrow<capsule>(((PyCFunctionObject *) m_ptr)->m_self);
                rec_capsule.set_pointer(rec);
            } else {
                // Or end of chain (normal behavior)
                chain_start = chain;
                while (chain->next)
                    chain = chain->next;
                chain->next = rec;
            }
        }

        std::string signatures;
        int index = 0;
        /* Create a nice pydoc rec including all signatures and
           docstrings of the functions in the overload chain */
        if (chain && options::show_function_signatures()) {
            // First a generic signature
            signatures += rec->name;
            signatures += "(*args, **kwargs)\n";
            signatures += "Overloaded function.\n\n";
        }
        // Then specific overload signatures
        bool first_user_def = true;
        for (auto it = chain_start; it != nullptr; it = it->next) {
            if (options::show_function_signatures()) {
                if (index > 0) signatures += "\n";
                if (chain)
                    signatures += std::to_string(++index) + ". ";
                signatures += rec->name;
                signatures += it->signature;
                signatures += "\n";
            }
            if (it->doc && strlen(it->doc) > 0 && options::show_user_defined_docstrings()) {
                // If we're appending another docstring, and aren't printing function signatures, we
                // need to append a newline first:
                if (!options::show_function_signatures()) {
                    if (first_user_def) first_user_def = false;
                    else signatures += "\n";
                }
                if (options::show_function_signatures()) signatures += "\n";
                signatures += it->doc;
                if (options::show_function_signatures()) signatures += "\n";
            }
        }

        /* Install docstring */
        auto *func = (PyCFunctionObject *) m_ptr;
        if (func->m_ml->ml_doc)
            std::free(const_cast<char *>(func->m_ml->ml_doc));
        func->m_ml->ml_doc = strdup(signatures.c_str());

        if (rec->is_method) {
            m_ptr = PYBIND11_INSTANCE_METHOD_NEW(m_ptr, rec->scope.ptr());
            if (!m_ptr)
                pybind11_fail("cpp_function::cpp_function(): Could not allocate instance method object");
            Py_DECREF(func);
        }
    }